

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O1

void ecs_workers_progress(ecs_world_t *world)

{
  ecs_entity_t eVar1;
  int32_t iVar2;
  int32_t iVar3;
  ecs_entity_t scope;
  bool bVar4;
  int iVar5;
  double dVar6;
  ecs_time_t start;
  ecs_time_t local_40;
  ecs_entity_t local_38;
  
  eVar1 = world->pipeline;
  iVar2 = ecs_vector_count(world->workers);
  local_40.sec = 0;
  local_40.nanosec = 0;
  if (world->measure_frame_time == true) {
    ecs_time_measure(&local_40);
  }
  iVar3 = ecs_pipeline_begin(world,eVar1);
  if (iVar2 < 2) {
    scope = ecs_set_scope(world,0);
    ecs_pipeline_progress(world,eVar1,(world->stats).delta_time);
    ecs_set_scope(world,scope);
  }
  else {
    local_38 = eVar1;
    iVar2 = ecs_vector_count(world->workers);
    bVar4 = true;
    do {
      (*ecs_os_api.mutex_lock_)(world->sync_mutex);
      if (world->workers_running == iVar2) {
        bVar4 = false;
      }
      (*ecs_os_api.mutex_unlock_)(world->sync_mutex);
      eVar1 = local_38;
    } while (bVar4);
    if (0 < iVar3) {
      iVar5 = 0;
      do {
        ecs_staging_begin(world);
        world->workers_waiting = 0;
        (*ecs_os_api.mutex_lock_)(world->sync_mutex);
        (*ecs_os_api.cond_broadcast_)(world->worker_cond);
        (*ecs_os_api.mutex_unlock_)(world->sync_mutex);
        iVar2 = ecs_vector_count(world->workers);
        (*ecs_os_api.mutex_lock_)(world->sync_mutex);
        if (world->workers_waiting != iVar2) {
          (*ecs_os_api.cond_wait_)(world->sync_cond,world->sync_mutex);
        }
        _ecs_assert(world->workers_waiting == iVar2,0xc,(char *)0x0,
                    "world->workers_waiting == thread_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/worker.c"
                    ,0x79);
        if (world->workers_waiting != iVar2) {
          __assert_fail("world->workers_waiting == thread_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/worker.c"
                        ,0x79,"void wait_for_sync(ecs_world_t *)");
        }
        (*ecs_os_api.mutex_unlock_)(world->sync_mutex);
        ecs_staging_end(world);
        iVar2 = ecs_pipeline_update(world,eVar1);
        if (iVar2 != 0) {
          iVar3 = iVar2;
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < iVar3);
    }
  }
  ecs_pipeline_end(world);
  if (world->measure_frame_time == true) {
    dVar6 = ecs_time_measure(&local_40);
    (world->stats).system_time_total = (float)dVar6 + (world->stats).system_time_total;
  }
  return;
}

Assistant:

void ecs_workers_progress(
    ecs_world_t *world)
{
    ecs_entity_t pipeline = world->pipeline;
    int32_t thread_count = ecs_vector_count(world->workers);

    ecs_time_t start = {0};
    if (world->measure_frame_time) {
        ecs_time_measure(&start);
    }

    if (thread_count <= 1) {
        ecs_pipeline_begin(world, pipeline);
        ecs_entity_t old_scope = ecs_set_scope(world, 0);
        ecs_pipeline_progress(world, pipeline, world->stats.delta_time);
        ecs_set_scope(world, old_scope);
        ecs_pipeline_end(world);
    } else {
        int32_t i, sync_count = ecs_pipeline_begin(world, pipeline);

        /* Make sure workers are running and ready */
        wait_for_workers(world);

        /* Synchronize n times for each op in the pipeline */
        for (i = 0; i < sync_count; i ++) {
            ecs_staging_begin(world);

            /* Signal workers that they should start running systems */
            world->workers_waiting = 0;
            signal_workers(world);

            /* Wait until all workers are waiting on sync point */
            wait_for_sync(world);

            /* Merge */
            ecs_staging_end(world);

            int32_t update_count;
            if ((update_count = ecs_pipeline_update(world, pipeline))) {
                /* The number of operations in the pipeline could have changed
                 * as result of the merge */
                sync_count = update_count;
            }
        }

        ecs_pipeline_end(world);
    }

    if (world->measure_frame_time) {
        world->stats.system_time_total += (FLECS_FLOAT)ecs_time_measure(&start);
    }    
}